

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_pfx.cpp
# Opt level: O0

void Palette16R5G5B5(PalEntry *pal)

{
  int local_1c;
  PfxUnion *pPStack_18;
  int i;
  WORD *p16;
  PalEntry *pal_local;
  
  pPStack_18 = &GPfxPal;
  p16 = (WORD *)pal;
  for (local_1c = 0x100; local_1c != 0; local_1c = local_1c + -1) {
    pPStack_18->Pal16[0] =
         ((byte)p16[1] & 0xf8) << 7 | (*(byte *)((long)p16 + 1) & 0xf8) << 2 |
         (ushort)((int)(uint)(byte)*p16 >> 3);
    p16 = p16 + 2;
    pPStack_18 = (PfxUnion *)(pPStack_18->Pal16 + 1);
  }
  return;
}

Assistant:

static void Palette16R5G5B5 (const PalEntry *pal)
{
	WORD *p16;
	int i;

	for (p16 = GPfxPal.Pal16, i = 256; i != 0; i--, pal++, p16++)
	{
		*p16 = ((pal->r << 7) & 0x7c00) |
			   ((pal->g << 2) & 0x03e0) |
			   ((pal->b >> 3) & 0x001f);
	}
}